

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::CommsBroker<helics::udp::UdpComms,_helics::CoreBroker>::loadComms
          (CommsBroker<helics::udp::UdpComms,_helics::CoreBroker> *this)

{
  UdpComms *this_00;
  __uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_> __p;
  __uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_> local_60;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::make_unique<helics::udp::UdpComms>();
  __p._M_t.
  super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>.
  super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl =
       local_60._M_t.
       super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>.
       super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl;
  local_60._M_t.
  super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>.
  super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl =
       (tuple<helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>)
       (_Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>)0x0;
  std::__uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>::reset
            ((__uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_> *)
             &this->comms,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
                      .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl);
  std::unique_ptr<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>::~unique_ptr
            ((unique_ptr<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_> *)
             &local_60);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/CommsBroker_impl.hpp:53:24)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/CommsBroker_impl.hpp:53:24)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  CommsInterface::setCallback
            ((CommsInterface *)
             (this->comms)._M_t.
             super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
             .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl,
             (function<void_(helics::ActionMessage_&&)> *)&local_38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  this_00 = (this->comms)._M_t.
            super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
            .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl;
  BrokerBase::getLoggingCallback(&(this->super_CoreBroker).super_BrokerBase);
  CommsInterface::setLoggingCallback((CommsInterface *)this_00,&local_58);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::loadComms()
{
    comms = std::make_unique<COMMS>();
    comms->setCallback([this](ActionMessage&& M) { BrokerBase::addActionMessage(std::move(M)); });
    comms->setLoggingCallback(BrokerBase::getLoggingCallback());
}